

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpipe.cpp
# Opt level: O0

optional<TokenPipe> TokenPipe::Make(void)

{
  int iVar1;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar2;
  _Storage<TokenPipe,_false> in_RDI;
  long in_FS_OFFSET;
  optional<TokenPipe> oVar3;
  int fds [2];
  TokenPipe *in_stack_ffffffffffffffa8;
  TokenPipe *__t;
  _Storage<TokenPipe,_false> this;
  TokenPipe local_18;
  int local_10 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10[0] = -1;
  local_10[1] = -1;
  this = in_RDI;
  iVar1 = pipe2(local_10,0x80000);
  if (iVar1 == 0) {
    __t = &local_18;
    TokenPipe(in_stack_ffffffffffffffa8,(int *)0x1b065e8);
    std::optional<TokenPipe>::optional<TokenPipe,_true>((optional<TokenPipe> *)this,__t);
    ~TokenPipe(in_stack_ffffffffffffffa8);
    uVar2 = extraout_EDX_00;
  }
  else {
    std::optional<TokenPipe>::optional((optional<TokenPipe> *)this.field2);
    uVar2 = extraout_EDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    oVar3.super__Optional_base<TokenPipe,_false,_false>._M_payload.
    super__Optional_payload<TokenPipe,_true,_false,_false>.super__Optional_payload_base<TokenPipe>.
    _8_4_ = uVar2;
    oVar3.super__Optional_base<TokenPipe,_false,_false>._M_payload.
    super__Optional_payload<TokenPipe,_true,_false,_false>.super__Optional_payload_base<TokenPipe>.
    _M_payload.field2 = in_RDI.field2;
    return (optional<TokenPipe>)
           oVar3.super__Optional_base<TokenPipe,_false,_false>._M_payload.
           super__Optional_payload<TokenPipe,_true,_false,_false>.
           super__Optional_payload_base<TokenPipe>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<TokenPipe> TokenPipe::Make()
{
    int fds[2] = {-1, -1};
#if HAVE_O_CLOEXEC && HAVE_DECL_PIPE2
    if (pipe2(fds, O_CLOEXEC) != 0) {
        return std::nullopt;
    }
#else
    if (pipe(fds) != 0) {
        return std::nullopt;
    }
#endif
    return TokenPipe(fds);
}